

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# savefile.c
# Opt level: O0

_Bool check_header(ang_file *f)

{
  int iVar1;
  int local_20;
  int local_1c;
  uint8_t head [8];
  ang_file *f_local;
  
  head = (uint8_t  [8])f;
  iVar1 = file_read(f,(char *)&local_20,8);
  if (((iVar1 == 8) && (local_20 == 0x65766153)) && (local_1c == 0x414c4e56)) {
    f_local._7_1_ = true;
  }
  else {
    f_local._7_1_ = false;
  }
  return f_local._7_1_;
}

Assistant:

static bool check_header(ang_file *f) {
	uint8_t head[8];

	if (file_read(f, (char *) &head, 8) == 8 &&
			memcmp(&head[0], savefile_magic, 4) == 0 &&
			memcmp(&head[4], savefile_name, 4) == 0)
		return true;

	return false;
}